

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O3

void multi_kv_custom_cmp_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  fdb_config *pfVar5;
  code *fconfig;
  char **kvs_names;
  char *unaff_RBP;
  char *pcVar6;
  fdb_config *pfVar7;
  char *unaff_R12;
  fdb_doc *doc_00;
  char *doc_01;
  char *unaff_R13;
  char *unaff_R14;
  fdb_custom_cmp_variable *functions;
  fdb_config *unaff_R15;
  fdb_config *doc_02;
  long lVar8;
  fdb_doc *doc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  fdb_kvs_handle *kv2;
  fdb_iterator *it;
  char value [256];
  timeval __test_begin;
  char key [256];
  char valueBuf [256];
  char keyBuf [256];
  timeval tStackY_1138;
  fdb_config fStackY_1128;
  fdb_file_handle *apfStackY_1030 [100];
  fdb_config *pfStackY_d10;
  fdb_custom_cmp_variable *pp_StackY_d08;
  fdb_config *pfStackY_d00;
  fdb_file_handle *pfStack_ce8;
  fdb_config *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd8;
  fdb_kvs_config fStack_cd0;
  timeval tStack_cb8;
  char acStack_ca8 [264];
  fdb_config fStack_ba0;
  fdb_custom_cmp_variable ap_Stack_aa8 [33];
  char **ppcStack_9a0;
  fdb_doc *pfStack_998;
  fdb_config *pfStack_990;
  fdb_custom_cmp_variable *pp_Stack_988;
  fdb_config *pfStack_980;
  fdb_config *pfStack_978;
  undefined1 auStack_960 [24];
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_config fStack_938;
  fdb_custom_cmp_variable p_Stack_920;
  code *pcStack_918;
  code *pcStack_910;
  char *pcStack_900;
  char *pcStack_8f8;
  char *pcStack_8f0;
  timeval tStack_8e0;
  fdb_config fStack_8d0;
  fdb_config fStack_7c8;
  fdb_custom_cmp_variable ap_Stack_6d0 [33];
  fdb_config *pfStack_5c8;
  fdb_config *pfStack_5c0;
  fdb_config *pfStack_5b8;
  fdb_config *pfStack_5b0;
  fdb_config *pfStack_5a8;
  fdb_config *pfStack_5a0;
  undefined1 local_590 [24];
  fdb_kvs_handle *local_578;
  fdb_kvs_handle *local_570;
  fdb_iterator *local_568;
  fdb_kvs_config local_560;
  fdb_config local_548;
  timeval local_448;
  fdb_config local_438;
  fdb_config local_330;
  fdb_custom_cmp_variable local_238 [32];
  char *local_138 [33];
  
  pfStack_5a0 = (fdb_config *)0x115159;
  gettimeofday(&local_448,(__timezone_ptr_t)0x0);
  local_548._0_8_ = 0x202066722d206d72;
  local_548.buffercache_size._0_2_ = 0x756d;
  local_548.buffercache_size._2_2_ = 0x746c;
  local_548.buffercache_size._4_3_ = 0x6b5f69;
  local_548.buffercache_size._7_1_ = 0x76;
  local_548.wal_threshold._0_7_ = 0x2a747365745f;
  pfStack_5a0 = (fdb_config *)0x11517b;
  system((char *)&local_548);
  pfStack_5a0 = (fdb_config *)0x115180;
  memleak_start();
  fconfig = (code *)&local_330;
  pfStack_5a0 = (fdb_config *)0x115190;
  fdb_get_default_config();
  pfStack_5a0 = (fdb_config *)0x11519a;
  fdb_get_default_kvs_config();
  local_330.seqtree_opt = '\x01';
  local_330.multi_kv_instances = true;
  local_330.wal_threshold = 0x100;
  local_330.wal_flush_before_commit = false;
  local_330.buffercache_size = 0;
  pfStack_5a0 = (fdb_config *)0x1151ca;
  fVar1 = fdb_open((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",(fdb_config *)fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161e9;
  pfStack_5a0 = (fdb_config *)0x1151e8;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,&local_578,(char *)0x0,&local_560);
  pfVar5 = (fdb_config *)fconfig;
  pfVar7 = (fdb_config *)unaff_RBP;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161ee;
  unaff_R14 = (char *)&local_438;
  unaff_R12 = "default";
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  pfVar5 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x11521e;
    sprintf(unaff_R14,"key%06d",pfVar5);
    pfStack_5a0 = (fdb_config *)0x115234;
    sprintf(unaff_R13,"value%08d(%s)",pfVar5);
    pfStack_5a0 = (fdb_config *)0x11523c;
    sVar3 = strlen(unaff_R14);
    unaff_R15 = (fdb_config *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115248;
    sVar3 = strlen(unaff_R13);
    pfStack_5a0 = (fdb_config *)0x115265;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R13,sVar3 + 1)
    ;
    pfStack_5a0 = (fdb_config *)0x115274;
    fVar1 = fdb_set(local_578,(fdb_doc *)local_590._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_5a0 = (fdb_config *)0x1160c4;
      multi_kv_custom_cmp_test();
      goto LAB_001160c4;
    }
    pfStack_5a0 = (fdb_config *)0x115286;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)pfVar5 + 1;
    pfVar5 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x1152a0;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161f3;
  local_560.custom_cmp = _multi_kv_test_keycmp;
  pfStack_5a0 = (fdb_config *)0x1152ce;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,(fdb_kvs_handle **)(local_590 + 0x10),
                       "kv1",&local_560);
  fconfig = (code *)pfVar5;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161f8;
  unaff_R14 = (char *)&local_438;
  unaff_R12 = "kv1_custom_cmp";
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  fconfig = (code *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115304;
    sprintf(unaff_R14,"key%06d",fconfig);
    pfStack_5a0 = (fdb_config *)0x11531a;
    sprintf(unaff_R13,"value%08d(%s)",fconfig);
    pfStack_5a0 = (fdb_config *)0x115322;
    sVar3 = strlen(unaff_R14);
    unaff_R15 = (fdb_config *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x11532e;
    sVar3 = strlen(unaff_R13);
    pfStack_5a0 = (fdb_config *)0x11534b;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R13,sVar3 + 1)
    ;
    pfStack_5a0 = (fdb_config *)0x11535a;
    fVar1 = fdb_set((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)fconfig;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160c4;
    pfStack_5a0 = (fdb_config *)0x11536c;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)fconfig + 1;
    fconfig = (code *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115386;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161fd;
  unaff_R15 = &local_438;
  pfVar7 = &local_548;
  unaff_R14 = local_590;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x1153b7;
    sprintf((char *)unaff_R15,"key%06d",unaff_R13);
    pfStack_5a0 = (fdb_config *)0x1153d2;
    sprintf((char *)pfVar7,"value%08d(%s)",unaff_R13);
    pfStack_5a0 = (fdb_config *)0x1153da;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x1153f9;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R15,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115408;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160d6;
    unaff_R12 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115428;
    iVar2 = bcmp(pfVar7,unaff_R12,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160c9;
    pfStack_5a0 = (fdb_config *)0x115438;
    fdb_doc_free((fdb_doc *)pfVar5);
    pfStack_5a0 = (fdb_config *)0x115453;
    sprintf((char *)pfVar7,"value%08d(%s)",unaff_R13);
    pfStack_5a0 = (fdb_config *)0x11545b;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x11547a;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R15,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115489;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    fconfig = (code *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160e8;
    unaff_R12 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x1154a9;
    iVar2 = bcmp(pfVar7,unaff_R12,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160db;
    pfStack_5a0 = (fdb_config *)0x1154b9;
    fdb_doc_free((fdb_doc *)fconfig);
    uVar4 = (int)unaff_R13 + 1;
    unaff_R13 = (char *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x1154d3;
  fVar1 = fdb_close((fdb_file_handle *)local_590._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116202;
  local_560.custom_cmp = (fdb_custom_cmp_variable)0x0;
  pfStack_5a0 = (fdb_config *)0x1154fd;
  fVar1 = fdb_open((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",&local_330);
  fconfig = _multi_kv_test_keycmp;
  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116207;
  local_138[0] = (char *)0x0;
  local_238[0] = _multi_kv_test_keycmp;
  pfStack_5a0 = (fdb_config *)0x115546;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",&local_330,1,
                              local_138,local_238,(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011620c;
  local_138[0] = "kv1";
  local_238[0] = _multi_kv_test_keycmp;
  pfStack_5a0 = (fdb_config *)0x115591;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",&local_330,1,
                              local_138,local_238,(void **)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116211;
  pfStack_5a0 = (fdb_config *)0x1155af;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,&local_578,(char *)0x0,&local_560);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116216;
  pfStack_5a0 = (fdb_config *)0x1155d2;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,(fdb_kvs_handle **)(local_590 + 0x10),
                       "kv1",&local_560);
  unaff_RBP = (char *)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011621b;
  unaff_R14 = (char *)&local_438;
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  unaff_R12 = (char *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115603;
    sprintf(unaff_R14,"key%06d",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x11561e;
    sprintf(unaff_R13,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115626;
    sVar3 = strlen(unaff_R14);
    pfStack_5a0 = (fdb_config *)0x115645;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115654;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160fa;
    unaff_R15 = *(fdb_config **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115674;
    iVar2 = bcmp(unaff_R13,unaff_R15,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160ed;
    pfStack_5a0 = (fdb_config *)0x115684;
    fdb_doc_free((fdb_doc *)pfVar5);
    pfStack_5a0 = (fdb_config *)0x11569f;
    sprintf(unaff_R13,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x1156a7;
    sVar3 = strlen(unaff_R14);
    pfStack_5a0 = (fdb_config *)0x1156c6;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x1156d5;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    fconfig = (code *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011610c;
    unaff_R15 = *(fdb_config **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x1156f5;
    iVar2 = bcmp(unaff_R13,unaff_R15,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160ff;
    pfStack_5a0 = (fdb_config *)0x115705;
    fdb_doc_free((fdb_doc *)fconfig);
    uVar4 = (int)unaff_R12 + 1;
    unaff_R12 = (char *)(ulong)uVar4;
  } while (uVar4 != 1000);
  local_560.custom_cmp = (fdb_custom_cmp_variable)0x0;
  pfStack_5a0 = (fdb_config *)0x115738;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,&local_570,"kv2",&local_560);
  unaff_RBP = (char *)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116220;
  unaff_R14 = (char *)&local_438;
  unaff_R12 = "kv2";
  unaff_R13 = (char *)&local_548;
  unaff_RBP = local_590;
  fconfig = (code *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x11576e;
    sprintf(unaff_R14,"key%06d",fconfig);
    pfStack_5a0 = (fdb_config *)0x115784;
    sprintf(unaff_R13,"value%08d(%s)",fconfig);
    pfStack_5a0 = (fdb_config *)0x11578c;
    sVar3 = strlen(unaff_R14);
    unaff_R15 = (fdb_config *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115798;
    sVar3 = strlen(unaff_R13);
    pfStack_5a0 = (fdb_config *)0x1157b5;
    fdb_doc_create((fdb_doc **)unaff_RBP,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R13,
                   sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x1157c4;
    fVar1 = fdb_set(local_570,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116111;
    pfStack_5a0 = (fdb_config *)0x1157d6;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)fconfig + 1;
    fconfig = (code *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x1157f0;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116225;
  unaff_R12 = (char *)&local_438;
  fconfig = (code *)&local_548;
  unaff_R14 = local_590;
  unaff_R15 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115821;
    sprintf(unaff_R12,"key%06d",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x11583c;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115844;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115863;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115872;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)local_590._0_8_;
    pcVar6 = unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116123;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115892;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116116;
    pfStack_5a0 = (fdb_config *)0x1158a2;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_5a0 = (fdb_config *)0x1158bd;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x1158c5;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x1158e4;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x1158f3;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pcVar6 = (char *)local_590._0_8_;
    unaff_RBP = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116135;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115913;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116128;
    pfStack_5a0 = (fdb_config *)0x115923;
    fdb_doc_free((fdb_doc *)pcVar6);
    pfStack_5a0 = (fdb_config *)0x11593e;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115946;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115965;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115974;
    fVar1 = fdb_get(local_570,(fdb_doc *)local_590._0_8_);
    unaff_RBP = (char *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116147;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115994;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011613a;
    pfStack_5a0 = (fdb_config *)0x1159a4;
    fdb_doc_free((fdb_doc *)unaff_RBP);
    uVar4 = (int)unaff_R15 + 1;
    unaff_R15 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  unaff_R13 = (char *)&local_438;
  unaff_R15 = &local_548;
  unaff_R12 = (char *)0x0;
  do {
    unaff_R14 = local_590;
    pfStack_5a0 = (fdb_config *)0x1159e0;
    sprintf(unaff_R13,"key%06d",unaff_R12);
    pcVar6 = "value%08d(%s)";
    pfStack_5a0 = (fdb_config *)0x1159fe;
    sprintf((char *)unaff_R15,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115a06;
    sVar3 = strlen(unaff_R13);
    fconfig = (code *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115a12;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115a2f;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R13,(size_t)fconfig,(void *)0x0,0,unaff_R15,sVar3 + 1
                  );
    pfStack_5a0 = (fdb_config *)0x115a3e;
    fVar1 = fdb_set(local_578,(fdb_doc *)local_590._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011614c;
    pfStack_5a0 = (fdb_config *)0x115a50;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    unaff_R14 = "key%06d";
    pfStack_5a0 = (fdb_config *)0x115a67;
    sprintf(unaff_R13,"key%06d",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115a7e;
    sprintf((char *)unaff_R15,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115a86;
    sVar3 = strlen(unaff_R13);
    fconfig = (code *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115a92;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115ab1;
    fdb_doc_create((fdb_doc **)local_590,unaff_R13,(size_t)fconfig,(void *)0x0,0,unaff_R15,sVar3 + 1
                  );
    pfStack_5a0 = (fdb_config *)0x115ac0;
    fVar1 = fdb_set((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116151;
    pfStack_5a0 = (fdb_config *)0x115ad2;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    unaff_RBP = "key%06d";
    pfStack_5a0 = (fdb_config *)0x115ae8;
    sprintf(unaff_R13,"key%06d",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115aff;
    sprintf((char *)unaff_R15,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115b07;
    sVar3 = strlen(unaff_R13);
    fconfig = (code *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115b13;
    sVar3 = strlen((char *)unaff_R15);
    unaff_R14 = local_590;
    pfStack_5a0 = (fdb_config *)0x115b35;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R13,(size_t)fconfig,(void *)0x0,0,unaff_R15,sVar3 + 1
                  );
    pfStack_5a0 = (fdb_config *)0x115b44;
    fVar1 = fdb_set(local_570,(fdb_doc *)local_590._0_8_);
    pcVar6 = unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116156;
    pfStack_5a0 = (fdb_config *)0x115b56;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)unaff_R12 + 1;
    unaff_R12 = (char *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115b72;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011622a;
  unaff_R12 = (char *)&local_438;
  fconfig = (code *)&local_548;
  unaff_R14 = local_590;
  unaff_R15 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115ba3;
    sprintf(unaff_R12,"key%06d",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115bbe;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115bc6;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115be5;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115bf4;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pcVar6 = (char *)local_590._0_8_;
    pfVar7 = (fdb_config *)unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116168;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115c14;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011615b;
    pfStack_5a0 = (fdb_config *)0x115c24;
    fdb_doc_free((fdb_doc *)pcVar6);
    pfStack_5a0 = (fdb_config *)0x115c3f;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115c47;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115c66;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115c75;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)local_590._0_8_;
    unaff_RBP = pcVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011617a;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115c95;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011616d;
    pfStack_5a0 = (fdb_config *)0x115ca5;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_5a0 = (fdb_config *)0x115cc0;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115cc8;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115ce7;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115cf6;
    fVar1 = fdb_get(local_570,(fdb_doc *)local_590._0_8_);
    unaff_RBP = (char *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011618c;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115d16;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011617f;
    pfStack_5a0 = (fdb_config *)0x115d26;
    fdb_doc_free((fdb_doc *)unaff_RBP);
    uVar4 = (int)unaff_R15 + 1;
    unaff_R15 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115d47;
  fVar1 = fdb_compact((fdb_file_handle *)local_590._8_8_,"./multi_kv_test2");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011622f;
  unaff_R12 = (char *)&local_438;
  fconfig = (code *)&local_548;
  unaff_R14 = local_590;
  unaff_R15 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115d78;
    sprintf(unaff_R12,"key%06d",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115d93;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115d9b;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115dba;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115dc9;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)local_590._0_8_;
    pfVar5 = (fdb_config *)unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011619e;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115de9;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116191;
    pfStack_5a0 = (fdb_config *)0x115df9;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_5a0 = (fdb_config *)0x115e14;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115e1c;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115e3b;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115e4a;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)local_590._0_8_;
    unaff_RBP = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161b0;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115e6a;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001161a3;
    pfStack_5a0 = (fdb_config *)0x115e7a;
    fdb_doc_free((fdb_doc *)pfVar5);
    pfStack_5a0 = (fdb_config *)0x115e95;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115e9d;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115ebc;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115ecb;
    fVar1 = fdb_get(local_570,(fdb_doc *)local_590._0_8_);
    unaff_RBP = (char *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161c2;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115eeb;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001161b5;
    pfStack_5a0 = (fdb_config *)0x115efb;
    fdb_doc_free((fdb_doc *)unaff_RBP);
    uVar4 = (int)unaff_R15 + 1;
    unaff_R15 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115f29;
  fVar1 = fdb_doc_create((fdb_doc **)local_590,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116234;
  *(char ***)(local_590._0_8_ + 0x20) = local_138;
  *(fdb_custom_cmp_variable **)(local_590._0_8_ + 0x40) = local_238;
  pfStack_5a0 = (fdb_config *)0x115f6e;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)local_590._16_8_,&local_568,(void *)0x0,0,(void *)0x0,
                            0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116239;
  unaff_R15 = &local_438;
  unaff_R13 = "kv1_custom_cmp(updated)";
  fconfig = (code *)&local_548;
  unaff_RBP = (char *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115f9b;
    fVar1 = fdb_iterator_get(local_568,(fdb_doc **)local_590);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161c7;
    pfStack_5a0 = (fdb_config *)0x115fb6;
    sprintf((char *)unaff_R15,"key%06d",unaff_RBP);
    pfStack_5a0 = (fdb_config *)0x115fcc;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_RBP,"kv1_custom_cmp(updated)");
    unaff_R12 = (char *)local_590._0_8_;
    unaff_R14 = *(char **)(local_590._0_8_ + 0x20);
    pfStack_5a0 = (fdb_config *)0x115fe5;
    iVar2 = bcmp(unaff_R14,unaff_R15,*(size_t *)local_590._0_8_);
    if (iVar2 != 0) goto LAB_001161cc;
    unaff_R14 = *(char **)((long)unaff_R12 + 0x40);
    pfStack_5a0 = (fdb_config *)0x116002;
    iVar2 = bcmp(unaff_R14,fconfig,*(uint64_t *)((long)unaff_R12 + 0x10));
    if (iVar2 != 0) goto LAB_001161dc;
    uVar4 = (int)unaff_RBP + 1;
    unaff_RBP = (char *)(ulong)uVar4;
    pfStack_5a0 = (fdb_config *)0x116016;
    fVar1 = fdb_iterator_next(local_568);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  if (uVar4 != 1000) goto LAB_0011623e;
  pfStack_5a0 = (fdb_config *)0x116034;
  fVar1 = fdb_iterator_close(local_568);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116243;
  pfStack_5a0 = (fdb_config *)0x116046;
  fVar1 = fdb_close((fdb_file_handle *)local_590._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116248;
  pfStack_5a0 = (fdb_config *)0x116053;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011624d;
  *(undefined8 *)(local_590._0_8_ + 0x20) = 0;
  *(undefined8 *)(local_590._0_8_ + 0x40) = 0;
  pfStack_5a0 = (fdb_config *)0x11606f;
  fVar1 = fdb_doc_free((fdb_doc *)local_590._0_8_);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_5a0 = (fdb_config *)0x11607c;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (multi_kv_custom_cmp_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pfStack_5a0 = (fdb_config *)0x1160ad;
    fprintf(_stderr,pcVar6,"multiple KV instances custom comparison function test");
    return;
  }
  goto LAB_00116252;
LAB_001168ed:
  pfStack_978 = (fdb_config *)0x1168f2;
  multi_kv_fdb_open_custom_cmp_test();
LAB_001168f2:
  pfStack_978 = (fdb_config *)0x1168f7;
  multi_kv_fdb_open_custom_cmp_test();
LAB_001168f7:
  pfStack_978 = (fdb_config *)0x116907;
  multi_kv_fdb_open_custom_cmp_test();
  doc_00 = (fdb_doc *)doc_01;
LAB_00116907:
  pfStack_978 = (fdb_config *)0x11690c;
  multi_kv_fdb_open_custom_cmp_test();
LAB_0011690c:
  pfStack_978 = (fdb_config *)0x11691c;
  multi_kv_fdb_open_custom_cmp_test();
  pcVar6 = (char *)doc_00;
LAB_0011691c:
  pfStack_978 = (fdb_config *)0x116921;
  multi_kv_fdb_open_custom_cmp_test();
LAB_00116921:
  pfStack_978 = (fdb_config *)0x116931;
  multi_kv_fdb_open_custom_cmp_test();
  doc_00 = (fdb_doc *)pcVar6;
LAB_00116931:
  functions = ap_Stack_6d0;
  unaff_R13 = (char *)&fStack_8d0;
  unaff_RBP = auStack_960;
  pfStack_978 = (fdb_config *)0x116936;
  multi_kv_fdb_open_custom_cmp_test();
  goto LAB_00116936;
LAB_00116e71:
  pfStackY_d00 = (fdb_config *)0x116e7e;
  multi_kv_use_existing_mode_test();
  pfVar7 = doc_02;
LAB_00116e7e:
  doc_02 = pfVar7;
  pfStackY_d00 = (fdb_config *)0x116e83;
  multi_kv_use_existing_mode_test();
LAB_00116e83:
  pfStackY_d00 = (fdb_config *)0x116e88;
  multi_kv_use_existing_mode_test();
LAB_00116e88:
  pfStackY_d00 = (fdb_config *)0x116e95;
  multi_kv_use_existing_mode_test();
  pfVar7 = doc_02;
LAB_00116e95:
  functions = ap_Stack_aa8;
  pfStackY_d00 = (fdb_config *)0x116e9a;
  multi_kv_use_existing_mode_test();
  goto LAB_00116e9a;
LAB_001160c4:
  unaff_R14 = (char *)&local_438;
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  pfStack_5a0 = (fdb_config *)0x1160c9;
  multi_kv_custom_cmp_test();
LAB_001160c9:
  pfStack_5a0 = (fdb_config *)0x1160d6;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar5;
LAB_001160d6:
  pfStack_5a0 = (fdb_config *)0x1160db;
  multi_kv_custom_cmp_test();
LAB_001160db:
  pfStack_5a0 = (fdb_config *)0x1160e8;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)fconfig;
LAB_001160e8:
  pfStack_5a0 = (fdb_config *)0x1160ed;
  multi_kv_custom_cmp_test();
LAB_001160ed:
  pfStack_5a0 = (fdb_config *)0x1160fa;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar5;
LAB_001160fa:
  pfStack_5a0 = (fdb_config *)0x1160ff;
  multi_kv_custom_cmp_test();
LAB_001160ff:
  pfStack_5a0 = (fdb_config *)0x11610c;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)fconfig;
LAB_0011610c:
  fconfig = (code *)pfVar5;
  pfStack_5a0 = (fdb_config *)0x116111;
  multi_kv_custom_cmp_test();
LAB_00116111:
  pfStack_5a0 = (fdb_config *)0x116116;
  multi_kv_custom_cmp_test();
LAB_00116116:
  pfStack_5a0 = (fdb_config *)0x116123;
  multi_kv_custom_cmp_test();
  pcVar6 = (char *)pfVar7;
LAB_00116123:
  pfStack_5a0 = (fdb_config *)0x116128;
  multi_kv_custom_cmp_test();
LAB_00116128:
  pfStack_5a0 = (fdb_config *)0x116135;
  multi_kv_custom_cmp_test();
  unaff_RBP = pcVar6;
LAB_00116135:
  pfStack_5a0 = (fdb_config *)0x11613a;
  multi_kv_custom_cmp_test();
LAB_0011613a:
  pfStack_5a0 = (fdb_config *)0x116147;
  multi_kv_custom_cmp_test();
  pcVar6 = unaff_RBP;
LAB_00116147:
  pfStack_5a0 = (fdb_config *)0x11614c;
  multi_kv_custom_cmp_test();
LAB_0011614c:
  pfStack_5a0 = (fdb_config *)0x116151;
  multi_kv_custom_cmp_test();
LAB_00116151:
  pfStack_5a0 = (fdb_config *)0x116156;
  multi_kv_custom_cmp_test();
LAB_00116156:
  pfStack_5a0 = (fdb_config *)0x11615b;
  multi_kv_custom_cmp_test();
LAB_0011615b:
  pfStack_5a0 = (fdb_config *)0x116168;
  multi_kv_custom_cmp_test();
  pfVar7 = (fdb_config *)pcVar6;
LAB_00116168:
  pfStack_5a0 = (fdb_config *)0x11616d;
  multi_kv_custom_cmp_test();
LAB_0011616d:
  pfStack_5a0 = (fdb_config *)0x11617a;
  multi_kv_custom_cmp_test();
  unaff_RBP = (char *)pfVar7;
LAB_0011617a:
  pfStack_5a0 = (fdb_config *)0x11617f;
  multi_kv_custom_cmp_test();
LAB_0011617f:
  pfStack_5a0 = (fdb_config *)0x11618c;
  multi_kv_custom_cmp_test();
  pfVar7 = (fdb_config *)unaff_RBP;
LAB_0011618c:
  pfStack_5a0 = (fdb_config *)0x116191;
  multi_kv_custom_cmp_test();
LAB_00116191:
  pfStack_5a0 = (fdb_config *)0x11619e;
  multi_kv_custom_cmp_test();
  pfVar5 = pfVar7;
LAB_0011619e:
  pfStack_5a0 = (fdb_config *)0x1161a3;
  multi_kv_custom_cmp_test();
LAB_001161a3:
  pfStack_5a0 = (fdb_config *)0x1161b0;
  multi_kv_custom_cmp_test();
  unaff_RBP = (char *)pfVar5;
LAB_001161b0:
  pfStack_5a0 = (fdb_config *)0x1161b5;
  multi_kv_custom_cmp_test();
LAB_001161b5:
  pfStack_5a0 = (fdb_config *)0x1161c2;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)unaff_RBP;
LAB_001161c2:
  unaff_RBP = (char *)pfVar5;
  pfStack_5a0 = (fdb_config *)0x1161c7;
  multi_kv_custom_cmp_test();
LAB_001161c7:
  pfStack_5a0 = (fdb_config *)0x1161cc;
  multi_kv_custom_cmp_test();
LAB_001161cc:
  pfStack_5a0 = (fdb_config *)0x1161dc;
  multi_kv_custom_cmp_test();
LAB_001161dc:
  pfStack_5a0 = (fdb_config *)0x1161e9;
  multi_kv_custom_cmp_test();
LAB_001161e9:
  pfStack_5a0 = (fdb_config *)0x1161ee;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)fconfig;
  pfVar7 = (fdb_config *)unaff_RBP;
LAB_001161ee:
  pfStack_5a0 = (fdb_config *)0x1161f3;
  multi_kv_custom_cmp_test();
LAB_001161f3:
  pfStack_5a0 = (fdb_config *)0x1161f8;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar5;
LAB_001161f8:
  pfStack_5a0 = (fdb_config *)0x1161fd;
  multi_kv_custom_cmp_test();
LAB_001161fd:
  pfStack_5a0 = (fdb_config *)0x116202;
  multi_kv_custom_cmp_test();
LAB_00116202:
  pfStack_5a0 = (fdb_config *)0x116207;
  multi_kv_custom_cmp_test();
LAB_00116207:
  pfStack_5a0 = (fdb_config *)0x11620c;
  multi_kv_custom_cmp_test();
LAB_0011620c:
  pfStack_5a0 = (fdb_config *)0x116211;
  multi_kv_custom_cmp_test();
LAB_00116211:
  pfStack_5a0 = (fdb_config *)0x116216;
  multi_kv_custom_cmp_test();
LAB_00116216:
  pfStack_5a0 = (fdb_config *)0x11621b;
  multi_kv_custom_cmp_test();
  unaff_RBP = (char *)pfVar7;
LAB_0011621b:
  pfStack_5a0 = (fdb_config *)0x116220;
  multi_kv_custom_cmp_test();
LAB_00116220:
  pfStack_5a0 = (fdb_config *)0x116225;
  multi_kv_custom_cmp_test();
LAB_00116225:
  pfStack_5a0 = (fdb_config *)0x11622a;
  multi_kv_custom_cmp_test();
LAB_0011622a:
  pfStack_5a0 = (fdb_config *)0x11622f;
  multi_kv_custom_cmp_test();
LAB_0011622f:
  pfStack_5a0 = (fdb_config *)0x116234;
  multi_kv_custom_cmp_test();
LAB_00116234:
  pfStack_5a0 = (fdb_config *)0x116239;
  multi_kv_custom_cmp_test();
LAB_00116239:
  pfStack_5a0 = (fdb_config *)0x11623e;
  multi_kv_custom_cmp_test();
LAB_0011623e:
  pfStack_5a0 = (fdb_config *)0x116243;
  multi_kv_custom_cmp_test();
LAB_00116243:
  pfStack_5a0 = (fdb_config *)0x116248;
  multi_kv_custom_cmp_test();
LAB_00116248:
  pfStack_5a0 = (fdb_config *)0x11624d;
  multi_kv_custom_cmp_test();
LAB_0011624d:
  pfStack_5a0 = (fdb_config *)0x116252;
  multi_kv_custom_cmp_test();
LAB_00116252:
  pfStack_5a0 = (fdb_config *)multi_kv_fdb_open_custom_cmp_test;
  multi_kv_custom_cmp_test();
  doc_00 = (fdb_doc *)0x0;
  pfStack_978 = (fdb_config *)0x11627a;
  pfStack_5c8 = (fdb_config *)fconfig;
  pfStack_5c0 = (fdb_config *)unaff_R12;
  pfStack_5b8 = (fdb_config *)unaff_R13;
  pfStack_5b0 = (fdb_config *)unaff_R14;
  pfStack_5a8 = unaff_R15;
  pfStack_5a0 = (fdb_config *)unaff_RBP;
  gettimeofday(&tStack_8e0,(__timezone_ptr_t)0x0);
  kvs_names = &pcStack_900;
  pcStack_8f0 = "kv2";
  pcStack_900 = "default";
  pcStack_8f8 = "kv1";
  functions = &p_Stack_920;
  pcStack_910 = (code *)0x0;
  p_Stack_920 = _multi_kv_test_keycmp;
  pcStack_918 = _multi_kv_test_keycmp;
  fStack_8d0.wal_threshold._0_1_ = '_';
  fStack_8d0.wal_threshold._1_1_ = 't';
  fStack_8d0.wal_threshold._2_1_ = 'e';
  fStack_8d0.wal_threshold._3_1_ = 's';
  fStack_8d0.wal_threshold._4_1_ = 't';
  fStack_8d0.wal_threshold._5_1_ = '*';
  fStack_8d0.wal_threshold._6_1_ = '\0';
  fStack_8d0._0_8_ = 0x202066722d206d72;
  fStack_8d0.buffercache_size._0_1_ = 'm';
  fStack_8d0.buffercache_size._1_1_ = 'u';
  fStack_8d0.buffercache_size._2_1_ = 'l';
  fStack_8d0.buffercache_size._3_1_ = 't';
  fStack_8d0.buffercache_size._4_1_ = 'i';
  fStack_8d0.buffercache_size._5_1_ = '_';
  fStack_8d0.buffercache_size._6_1_ = 'k';
  fStack_8d0.buffercache_size._7_1_ = 'v';
  pfStack_978 = (fdb_config *)0x1162d4;
  system((char *)&fStack_8d0);
  pfStack_978 = (fdb_config *)0x1162d9;
  memleak_start();
  pfVar7 = &fStack_7c8;
  pfStack_978 = (fdb_config *)0x1162e9;
  fdb_get_default_config();
  pfStack_978 = (fdb_config *)0x1162f3;
  fdb_get_default_kvs_config();
  fStack_7c8.seqtree_opt = '\x01';
  fStack_7c8.multi_kv_instances = true;
  fStack_7c8.wal_threshold = 0x100;
  fStack_7c8.wal_flush_before_commit = false;
  fStack_7c8.buffercache_size = 0;
  pfStack_978 = (fdb_config *)0x116331;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",pfVar7,3,
                              kvs_names,functions,(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_978 = (fdb_config *)0x11634f;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_940,(char *)0x0,&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011693b;
    pfStack_978 = (fdb_config *)0x116372;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_948,"kv1",&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116940;
    fStack_938.custom_cmp = _multi_kv_test_keycmp;
    pfStack_978 = (fdb_config *)0x1163a0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,
                         (fdb_kvs_handle **)(auStack_960 + 0x10),"kv2",&fStack_938);
    pcVar6 = (char *)doc_00;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116945;
    doc_01 = "default";
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x1163d9;
      sprintf((char *)ap_Stack_6d0,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x1163ef;
      sprintf((char *)&fStack_8d0,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x1163f7;
      sVar3 = strlen((char *)ap_Stack_6d0);
      pfVar7 = (fdb_config *)(sVar3 + 1);
      pfStack_978 = (fdb_config *)0x116403;
      sVar3 = strlen((char *)&fStack_8d0);
      pfStack_978 = (fdb_config *)0x116420;
      fdb_doc_create((fdb_doc **)auStack_960,ap_Stack_6d0,(size_t)pfVar7,(void *)0x0,0,&fStack_8d0,
                     sVar3 + 1);
      pfStack_978 = (fdb_config *)0x11642f;
      fVar1 = fdb_set(pfStack_940,(fdb_doc *)auStack_960._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_978 = (fdb_config *)0x1168ed;
        multi_kv_fdb_open_custom_cmp_test();
        goto LAB_001168ed;
      }
      pfStack_978 = (fdb_config *)0x116441;
      fdb_doc_free((fdb_doc *)auStack_960._0_8_);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    doc_01 = "kv1_custom_cmp";
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x116480;
      sprintf((char *)ap_Stack_6d0,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x116496;
      sprintf((char *)&fStack_8d0,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x11649e;
      sVar3 = strlen((char *)ap_Stack_6d0);
      pfVar7 = (fdb_config *)(sVar3 + 1);
      pfStack_978 = (fdb_config *)0x1164aa;
      sVar3 = strlen((char *)&fStack_8d0);
      pfStack_978 = (fdb_config *)0x1164c7;
      fdb_doc_create((fdb_doc **)auStack_960,ap_Stack_6d0,(size_t)pfVar7,(void *)0x0,0,&fStack_8d0,
                     sVar3 + 1);
      pfStack_978 = (fdb_config *)0x1164d6;
      fVar1 = fdb_set(pfStack_948,(fdb_doc *)auStack_960._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001168ed;
      pfStack_978 = (fdb_config *)0x1164e8;
      fdb_doc_free((fdb_doc *)auStack_960._0_8_);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    functions = ap_Stack_6d0;
    pcVar6 = "kv2";
    unaff_R13 = (char *)&fStack_8d0;
    unaff_RBP = auStack_960;
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x116527;
      sprintf((char *)functions,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x11653d;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x116545;
      sVar3 = strlen((char *)functions);
      pfVar7 = (fdb_config *)(sVar3 + 1);
      pfStack_978 = (fdb_config *)0x116551;
      sVar3 = strlen(unaff_R13);
      pfStack_978 = (fdb_config *)0x11656e;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,(size_t)pfVar7,(void *)0x0,0,unaff_R13,
                     sVar3 + 1);
      pfStack_978 = (fdb_config *)0x11657d;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_960._16_8_,(fdb_doc *)auStack_960._0_8_);
      doc_01 = pcVar6;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001168f2;
      pfStack_978 = (fdb_config *)0x11658f;
      fdb_doc_free((fdb_doc *)auStack_960._0_8_);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStack_978 = (fdb_config *)0x1165a9;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_960._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011694a;
    pfStack_978 = (fdb_config *)0x1165bb;
    fVar1 = fdb_close((fdb_file_handle *)auStack_960._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011694f;
    pfStack_978 = (fdb_config *)0x1165dc;
    fVar1 = fdb_open((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",&fStack_7c8);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116954;
    pfStack_978 = (fdb_config *)0x116614;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",&fStack_7c8,
                                3,&pcStack_900,&p_Stack_920,(void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116959;
    pcStack_910 = _multi_kv_test_keycmp;
    pfStack_978 = (fdb_config *)0x116657;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",&fStack_7c8,
                                3,&pcStack_900,&p_Stack_920,(void **)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011695e;
    pfStack_978 = (fdb_config *)0x116675;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_940,(char *)0x0,&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116963;
    pfStack_978 = (fdb_config *)0x116698;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_948,"kv1",&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116968;
    pfStack_978 = (fdb_config *)0x1166bb;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,
                         (fdb_kvs_handle **)(auStack_960 + 0x10),"kv2",&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011696d;
    functions = ap_Stack_6d0;
    unaff_R13 = (char *)&fStack_8d0;
    unaff_RBP = auStack_960;
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x1166ed;
      sprintf((char *)functions,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x116707;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x11670f;
      sVar3 = strlen((char *)functions);
      pfStack_978 = (fdb_config *)0x11672e;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_978 = (fdb_config *)0x11673d;
      fVar1 = fdb_get(pfStack_940,(fdb_doc *)auStack_960._0_8_);
      doc_01 = (char *)auStack_960._0_8_;
      doc_00 = (fdb_doc *)pcVar6;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116907;
      pfVar7 = *(fdb_config **)(auStack_960._0_8_ + 0x40);
      pfStack_978 = (fdb_config *)0x11675f;
      iVar2 = bcmp(unaff_R13,pfVar7,*(size_t *)(auStack_960._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001168f7;
      pfStack_978 = (fdb_config *)0x11676f;
      fdb_doc_free((fdb_doc *)doc_01);
      pfStack_978 = (fdb_config *)0x116789;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x116791;
      sVar3 = strlen((char *)functions);
      pfStack_978 = (fdb_config *)0x1167b0;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_978 = (fdb_config *)0x1167bf;
      fVar1 = fdb_get(pfStack_948,(fdb_doc *)auStack_960._0_8_);
      doc_00 = (fdb_doc *)auStack_960._0_8_;
      pcVar6 = doc_01;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011691c;
      pfVar7 = *(fdb_config **)(auStack_960._0_8_ + 0x40);
      pfStack_978 = (fdb_config *)0x1167e1;
      iVar2 = bcmp(unaff_R13,pfVar7,*(size_t *)(auStack_960._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011690c;
      pfStack_978 = (fdb_config *)0x1167f1;
      fdb_doc_free(doc_00);
      pfStack_978 = (fdb_config *)0x11680b;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x116813;
      sVar3 = strlen((char *)functions);
      pfStack_978 = (fdb_config *)0x116832;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_978 = (fdb_config *)0x116841;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_960._16_8_,(fdb_doc *)auStack_960._0_8_);
      pcVar6 = (char *)auStack_960._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116931;
      pfVar7 = *(fdb_config **)(auStack_960._0_8_ + 0x40);
      pfStack_978 = (fdb_config *)0x116863;
      iVar2 = bcmp(unaff_R13,pfVar7,*(size_t *)(auStack_960._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00116921;
      pfStack_978 = (fdb_config *)0x116873;
      fdb_doc_free((fdb_doc *)pcVar6);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStack_978 = (fdb_config *)0x11688b;
    fVar1 = fdb_close((fdb_file_handle *)auStack_960._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116972;
    pfStack_978 = (fdb_config *)0x116898;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_978 = (fdb_config *)0x1168a5;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (multi_kv_fdb_open_custom_cmp_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_978 = (fdb_config *)0x1168d6;
      fprintf(_stderr,pcVar6,"multiple KV instances fdb_open_custom_cmp test");
      return;
    }
  }
  else {
LAB_00116936:
    pfStack_978 = (fdb_config *)0x11693b;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011693b:
    pfStack_978 = (fdb_config *)0x116940;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116940:
    pfStack_978 = (fdb_config *)0x116945;
    multi_kv_fdb_open_custom_cmp_test();
    pcVar6 = (char *)doc_00;
LAB_00116945:
    pfStack_978 = (fdb_config *)0x11694a;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011694a:
    pfStack_978 = (fdb_config *)0x11694f;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011694f:
    pfStack_978 = (fdb_config *)0x116954;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116954:
    pfStack_978 = (fdb_config *)0x116959;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116959:
    pfStack_978 = (fdb_config *)0x11695e;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011695e:
    pfStack_978 = (fdb_config *)0x116963;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116963:
    pfStack_978 = (fdb_config *)0x116968;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116968:
    pfStack_978 = (fdb_config *)0x11696d;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011696d:
    pfStack_978 = (fdb_config *)0x116972;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116972:
    pfStack_978 = (fdb_config *)0x116977;
    multi_kv_fdb_open_custom_cmp_test();
  }
  pfStack_978 = (fdb_config *)multi_kv_use_existing_mode_test;
  multi_kv_fdb_open_custom_cmp_test();
  pfStackY_d00 = (fdb_config *)0x116999;
  ppcStack_9a0 = kvs_names;
  pfStack_998 = (fdb_doc *)pcVar6;
  pfStack_990 = (fdb_config *)unaff_R13;
  pp_Stack_988 = functions;
  pfStack_980 = pfVar7;
  pfStack_978 = (fdb_config *)unaff_RBP;
  gettimeofday(&tStack_cb8,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_ca8,"rm -rf  multi_kv_test*",0x17);
  pfStackY_d00 = (fdb_config *)0x1169bb;
  system(acStack_ca8);
  pfStackY_d00 = (fdb_config *)0x1169c0;
  memleak_start();
  pfVar5 = &fStack_ba0;
  pfStackY_d00 = (fdb_config *)0x1169d0;
  fdb_get_default_config();
  pfStackY_d00 = (fdb_config *)0x1169da;
  fdb_get_default_kvs_config();
  fStack_ba0.seqtree_opt = '\x01';
  fStack_ba0.wal_threshold = 0x100;
  fStack_ba0.buffercache_size = 0;
  fStack_ba0.multi_kv_instances = true;
  pfStackY_d00 = (fdb_config *)0x116a06;
  fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_multi",pfVar5);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStackY_d00 = (fdb_config *)0x116a24;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    doc_02 = pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e9f;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    do {
      pfStackY_d00 = (fdb_config *)0x116a5a;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116a70;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116a78;
      sVar3 = strlen((char *)functions);
      doc_02 = (fdb_config *)(sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116a84;
      sVar3 = strlen(acStack_ca8);
      pfStackY_d00 = (fdb_config *)0x116aa1;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,(size_t)doc_02,(void *)0x0,0,acStack_ca8,
                     sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116ab0;
      fVar1 = fdb_set(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStackY_d00 = (fdb_config *)0x116e71;
        multi_kv_use_existing_mode_test();
        goto LAB_00116e71;
      }
      pfStackY_d00 = (fdb_config *)0x116ac2;
      fdb_doc_free((fdb_doc *)pfStack_ce0);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116adc;
    fVar1 = fdb_commit(pfStack_ce8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ea4;
    pfStackY_d00 = (fdb_config *)0x116aee;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ea9;
    fStack_ba0.multi_kv_instances = false;
    pfStackY_d00 = (fdb_config *)0x116b13;
    fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_multi",&fStack_ba0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eae;
    pfStackY_d00 = (fdb_config *)0x116b31;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb3;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    pfVar7 = doc_02;
    do {
      pfStackY_d00 = (fdb_config *)0x116b60;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116b7a;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116b82;
      sVar3 = strlen((char *)functions);
      pfStackY_d00 = (fdb_config *)0x116ba1;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_d00 = (fdb_config *)0x116bb0;
      fVar1 = fdb_get(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      doc_02 = pfStack_ce0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e7e;
      pfStackY_d00 = (fdb_config *)0x116bd0;
      iVar2 = bcmp(acStack_ca8,*(void **)&pfStack_ce0->multi_kv_instances,pfStack_ce0->wal_threshold
                  );
      if (iVar2 != 0) goto LAB_00116e71;
      pfStackY_d00 = (fdb_config *)0x116be0;
      fdb_doc_free((fdb_doc *)doc_02);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
      pfVar7 = doc_02;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116bf8;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb8;
    fStack_ba0.multi_kv_instances = false;
    pfStackY_d00 = (fdb_config *)0x116c1d;
    fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_single",&fStack_ba0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ebd;
    pfStackY_d00 = (fdb_config *)0x116c3b;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec2;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    do {
      pfStackY_d00 = (fdb_config *)0x116c71;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116c87;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116c8f;
      sVar3 = strlen((char *)functions);
      doc_02 = (fdb_config *)(sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116c9b;
      sVar3 = strlen(acStack_ca8);
      pfStackY_d00 = (fdb_config *)0x116cb8;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,(size_t)doc_02,(void *)0x0,0,acStack_ca8,
                     sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116cc7;
      fVar1 = fdb_set(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e83;
      pfStackY_d00 = (fdb_config *)0x116cd9;
      fdb_doc_free((fdb_doc *)pfStack_ce0);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116cf3;
    fVar1 = fdb_commit(pfStack_ce8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec7;
    pfStackY_d00 = (fdb_config *)0x116d05;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ecc;
    fStack_ba0.multi_kv_instances = true;
    pfStackY_d00 = (fdb_config *)0x116d2a;
    fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_single",&fStack_ba0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed1;
    pfStackY_d00 = (fdb_config *)0x116d48;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed6;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    pfVar7 = doc_02;
    do {
      pfStackY_d00 = (fdb_config *)0x116d77;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116d91;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116d99;
      sVar3 = strlen((char *)functions);
      pfStackY_d00 = (fdb_config *)0x116db8;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_d00 = (fdb_config *)0x116dc7;
      fVar1 = fdb_get(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      doc_02 = pfStack_ce0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e95;
      pfStackY_d00 = (fdb_config *)0x116de7;
      iVar2 = bcmp(acStack_ca8,*(void **)&pfStack_ce0->multi_kv_instances,pfStack_ce0->wal_threshold
                  );
      if (iVar2 != 0) goto LAB_00116e88;
      pfStackY_d00 = (fdb_config *)0x116df7;
      fdb_doc_free((fdb_doc *)doc_02);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
      pfVar7 = doc_02;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116e0f;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_d00 = (fdb_config *)0x116e1c;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pfStackY_d00 = (fdb_config *)0x116e29;
        memleak_end();
        pcVar6 = "%s PASSED\n";
        if (multi_kv_use_existing_mode_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pfStackY_d00 = (fdb_config *)0x116e5a;
        fprintf(_stderr,pcVar6,"multiple KV instances use existing mode test");
        return;
      }
      goto LAB_00116ee0;
    }
  }
  else {
LAB_00116e9a:
    pfStackY_d00 = (fdb_config *)0x116e9f;
    multi_kv_use_existing_mode_test();
    doc_02 = pfVar7;
LAB_00116e9f:
    pfStackY_d00 = (fdb_config *)0x116ea4;
    multi_kv_use_existing_mode_test();
LAB_00116ea4:
    pfStackY_d00 = (fdb_config *)0x116ea9;
    multi_kv_use_existing_mode_test();
LAB_00116ea9:
    pfStackY_d00 = (fdb_config *)0x116eae;
    multi_kv_use_existing_mode_test();
LAB_00116eae:
    pfStackY_d00 = (fdb_config *)0x116eb3;
    multi_kv_use_existing_mode_test();
LAB_00116eb3:
    pfStackY_d00 = (fdb_config *)0x116eb8;
    multi_kv_use_existing_mode_test();
LAB_00116eb8:
    pfStackY_d00 = (fdb_config *)0x116ebd;
    multi_kv_use_existing_mode_test();
LAB_00116ebd:
    pfStackY_d00 = (fdb_config *)0x116ec2;
    multi_kv_use_existing_mode_test();
LAB_00116ec2:
    pfStackY_d00 = (fdb_config *)0x116ec7;
    multi_kv_use_existing_mode_test();
LAB_00116ec7:
    pfStackY_d00 = (fdb_config *)0x116ecc;
    multi_kv_use_existing_mode_test();
LAB_00116ecc:
    pfStackY_d00 = (fdb_config *)0x116ed1;
    multi_kv_use_existing_mode_test();
LAB_00116ed1:
    pfStackY_d00 = (fdb_config *)0x116ed6;
    multi_kv_use_existing_mode_test();
LAB_00116ed6:
    pfStackY_d00 = (fdb_config *)0x116edb;
    multi_kv_use_existing_mode_test();
  }
  pfStackY_d00 = (fdb_config *)0x116ee0;
  multi_kv_use_existing_mode_test();
LAB_00116ee0:
  pfStackY_d00 = (fdb_config *)_opening_thread;
  multi_kv_use_existing_mode_test();
  pfStackY_d10 = pfVar5;
  pp_StackY_d08 = functions;
  pfStackY_d00 = doc_02;
  fdb_get_default_config();
  lVar8 = 0;
  gettimeofday(&tStackY_1138,(__timezone_ptr_t)0x0);
  do {
    fVar1 = fdb_open((fdb_file_handle **)((long)apfStackY_1030 + lVar8),"multi_kv_test2",
                     &fStackY_1128);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x92d);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x92d,"void *_opening_thread(void *)");
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 800);
  lVar8 = 0;
  do {
    fVar1 = fdb_close(apfStackY_1030[lVar8]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x931);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x931,"void *_opening_thread(void *)");
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 100);
  pthread_exit((void *)0x0);
}

Assistant:

void multi_kv_custom_cmp_test()
{
    TEST_INIT();

    int n = 1000;
    int i, r;
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_iterator *it;
    fdb_status s;

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.multi_kv_instances = true;
    config.wal_threshold = 256;
    config.wal_flush_before_commit = false;
    config.buffercache_size = 0;

    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'default' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create 'kv1' using custom cmp function
    kvs_config.custom_cmp = _multi_kv_test_keycmp;
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & reopen handles
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    kvs_config.custom_cmp = NULL;
    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail

    { // retry with wrong cmp function
        char *kvs_names[] = {NULL};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail
    }

    { // retry with correct function
        char *kvs_names[] = {(char*)"kv1"};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS); // must succeed this time
    }

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // create one more KV store
    kvs_config.custom_cmp = NULL;
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv2' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // update all documents
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // WAL flush at once
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // do compaction
    s = fdb_compact(dbfile, "./multi_kv_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // pre-allocate memory and re-use it for the iterator return document
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->body = &valueBuf[0];

    // create full iterator for 'kv1'
    i = 0;
    s = fdb_iterator_init(kv1, &it, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    do {
        s = fdb_iterator_get(it, &doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        i++;
    } while (fdb_iterator_next(it) == FDB_RESULT_SUCCESS);
    TEST_CHK(i == n);
    s = fdb_iterator_close(it);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // release the pre-allocated memory for the iterator return document
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();

    TEST_RESULT("multiple KV instances custom comparison function test");
}